

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_libmeshb_block.c
# Opt level: O2

int main(void)

{
  undefined4 uVar1;
  undefined8 uVar2;
  int64_t iVar3;
  ulong uVar4;
  void *pvVar5;
  void *pvVar6;
  void *__ptr;
  long lVar7;
  undefined4 *puVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long EndIdx;
  int dim;
  int ver;
  long local_a0;
  long local_98;
  void *local_90;
  long local_88;
  void *local_80;
  long local_78;
  void *local_70;
  long local_68;
  long local_60;
  long local_58;
  void *local_50;
  void *local_48;
  ulong local_40;
  int64_t local_38;
  
  iVar11 = 1;
  iVar3 = GmfOpenMesh("../sample_meshes/quad.meshb",1,&ver,&dim);
  if (iVar3 != 0) {
    lVar12 = 0;
    printf("InpMsh : idx = %ld, version = %d, dimension = %d\n",iVar3,(ulong)(uint)ver,
           (ulong)(uint)dim);
    if (dim != 3) {
      exit(1);
    }
    uVar4 = GmfStatKwd(iVar3,4);
    local_38 = iVar3;
    printf("InpMsh : nmb vertices = %d\n",uVar4 & 0xffffffff);
    pvVar5 = malloc((long)((int)uVar4 * 3 + 3) << 2);
    EndIdx = (long)(int)uVar4;
    pvVar6 = malloc(EndIdx * 4 + 4);
    uVar4 = GmfStatKwd(iVar3,7);
    local_40 = uVar4;
    printf("InpMsh : nmb quads = %d\n",uVar4 & 0xffffffff);
    __ptr = malloc((long)(((int)uVar4 + 1) * 5) << 2);
    local_80 = malloc((long)((int)uVar4 * 8 + 8) << 2);
    iVar3 = local_38;
    local_88 = (long)pvVar5 + 0xc;
    lVar7 = EndIdx * 0xc;
    local_90 = (void *)((long)pvVar5 + lVar7);
    local_98 = (long)pvVar5 + 0x10;
    local_a0 = (long)pvVar5 + lVar7 + 4;
    local_60 = (long)pvVar5 + lVar7 + 8;
    local_58 = (long)pvVar5 + 0x14;
    local_70 = (void *)(EndIdx * 4 + (long)pvVar6);
    local_68 = (long)pvVar6 + 4;
    local_78 = EndIdx;
    local_50 = pvVar6;
    local_48 = pvVar5;
    GmfGetBlock(local_38,4,1,EndIdx,0,(void *)0x0,(void *)0x0,8,local_88,local_90,8,local_98,
                local_a0,8,local_58,local_60,10,local_68,local_70);
    uVar4 = local_40;
    iVar10 = (int)local_40;
    GmfGetBlock(iVar3,7,1,(long)iVar10,0,(void *)0x0,(void *)0x0,0xe,5,(long)__ptr + 0x14,
                (void *)((long)iVar10 * 0x14 + (long)__ptr));
    GmfCloseMesh(iVar3);
    uVar9 = 0;
    if (0 < iVar10) {
      uVar9 = uVar4 & 0xffffffff;
    }
    puVar8 = (undefined4 *)((long)local_80 + 0x2c);
    iVar11 = 1;
    for (; uVar9 * 0x14 - lVar12 != 0; lVar12 = lVar12 + 0x14) {
      uVar2 = *(undefined8 *)((long)__ptr + lVar12 + 0x14);
      *(undefined8 *)(puVar8 + -7) = uVar2;
      uVar1 = *(undefined4 *)((long)__ptr + lVar12 + 0x24);
      puVar8[-4] = uVar1;
      puVar8[-3] = (int)uVar2;
      uVar2 = *(undefined8 *)((long)__ptr + lVar12 + 0x1c);
      puVar8[-5] = (int)uVar2;
      *(undefined8 *)(puVar8 + -2) = uVar2;
      *puVar8 = uVar1;
      puVar8 = puVar8 + 8;
    }
    iVar3 = GmfOpenMesh("tri.meshb",2,(ulong)(uint)ver,(ulong)(uint)dim);
    lVar12 = local_78;
    if (iVar3 != 0) {
      GmfSetKwd(iVar3,4,local_78);
      GmfSetBlock(iVar3,4,1,lVar12,0,(void *)0x0,(void *)0x0,8,local_88,local_90,8,local_98,local_a0
                  ,8,local_58,local_60,10,local_68,local_70);
      lVar7 = (long)(iVar10 * 2);
      GmfSetKwd(iVar3,6,lVar7);
      pvVar5 = local_80;
      local_88 = (long)local_80 + 0x10;
      lVar12 = lVar7 * 0x10;
      local_90 = (void *)((long)local_80 + lVar12);
      local_98 = (long)local_80 + 0x14;
      local_a0 = (long)local_80 + lVar12 + 4;
      GmfSetBlock(iVar3,6,1,lVar7,0,(void *)0x0,(void *)0x0,10,local_88,local_90,10,local_98,
                  local_a0,10,(long)local_80 + 0x18,(long)local_80 + lVar12 + 8,10,
                  (long)local_80 + 0x1c,(long)local_80 + lVar12 + 0xc);
      GmfCloseMesh(iVar3);
      printf("OutMsh : nmb triangles = %d\n",(ulong)(uint)(iVar10 * 2));
      free(__ptr);
      free(pvVar5);
      free(local_50);
      free(local_48);
      iVar11 = 0;
    }
  }
  return iVar11;
}

Assistant:

int main()
{
   int   i, NmbVer, NmbQad, ver, dim, *RefTab, (*QadTab)[5], (*TriTab)[4];
   //int   TypTab[ GmfMaxTyp ], SizTab[ GmfMaxTyp ];
   //void *BegTab[ GmfMaxTyp ], *EndTab[ GmfMaxTyp ];
   int64_t InpMsh, OutMsh;
   float (*VerTab)[3];


   /*-----------------------------------*/
   /* Open mesh file "quad.meshb"       */
   /*-----------------------------------*/

   if(!(InpMsh = GmfOpenMesh("../sample_meshes/quad.meshb", GmfRead, &ver, &dim)))
      return(1);

   printf("InpMsh : idx = "INT64_T_FMT", version = %d, dimension = %d\n", InpMsh, ver, dim);

   if(dim != 3)
      exit(1);

   // Read the number of vertices and allocate memory
   NmbVer = (int)GmfStatKwd(InpMsh, GmfVertices);
   printf("InpMsh : nmb vertices = %d\n", NmbVer);
   VerTab = malloc((NmbVer+1) * 3 * sizeof(float));
   RefTab = malloc((NmbVer+1) * sizeof(int));

   // Read the number of quads and allocate memory
   NmbQad = (int)GmfStatKwd(InpMsh, GmfQuadrilaterals);
   printf("InpMsh : nmb quads = %d\n", NmbQad);
   QadTab = malloc((NmbQad+1) * 5 * sizeof(int));
   TriTab = malloc((NmbQad+1) * 2 * 4 * sizeof(int));

   // Read the vertices: choose one of the four available methods

   // First method: argument list with scalar pointers
   GmfGetBlock(InpMsh, GmfVertices, 1, NmbVer, 0, NULL, NULL,
            GmfFloat, &VerTab[1][0], &VerTab[ NmbVer ][0],
            GmfFloat, &VerTab[1][1], &VerTab[ NmbVer ][1],
            GmfFloat, &VerTab[1][2], &VerTab[ NmbVer ][2],
            GmfInt,   &RefTab[1],    &RefTab[ NmbVer ] );

   // 2nd method: argument list with vector pointers
   /*GmfGetBlock(InpMsh, GmfVertices, 1, NmbVer, 0, NULL, NULL,
               GmfFloatVec, 3, &VerTab[1][0], &VerTab[ NmbVer ][0],
               GmfInt,         &RefTab[1],    &RefTab[ NmbVer ] );*/

   // 3rd method: argument table with scalar pointers
   /*TypTab[0] = GmfFloat;
   BegTab[0] = (void *)&VerTab[      1 ][0];
   EndTab[0] = (void *)&VerTab[ NmbVer ][0];

   TypTab[1] = GmfFloat;
   BegTab[1] = (void *)&VerTab[      1 ][1];
   EndTab[1] = (void *)&VerTab[ NmbVer ][1];

   TypTab[2] = GmfFloat;
   BegTab[2] = (void *)&VerTab[      1 ][2];
   EndTab[2] = (void *)&VerTab[ NmbVer ][2];

   TypTab[3] = GmfInt;
   BegTab[3] = (void *)&RefTab[      1 ];
   EndTab[3] = (void *)&RefTab[ NmbVer ];

   GmfGetBlock(InpMsh, GmfVertices, 1, NmbVer, 0, NULL, NULL,
               GmfArgTab, TypTab, SizTab, BegTab, EndTab );*/

   // 4th method: argument table with vector pointers
   /*TypTab[0] = GmfFloatVec;
   SizTab[0] = 3;
   BegTab[0] = (void *)&VerTab[      1 ][0];
   EndTab[0] = (void *)&VerTab[ NmbVer ][0];

   TypTab[1] = GmfInt;
   BegTab[1] = (void *)&RefTab[      1 ];
   EndTab[1] = (void *)&RefTab[ NmbVer ];

   GmfGetBlock(InpMsh, GmfVertices, 1, NmbVer, 0, NULL, NULL,
               GmfArgTab, TypTab, SizTab, BegTab, EndTab );*/

   // Read the quads
   GmfGetBlock(InpMsh, GmfQuadrilaterals, 1, NmbQad, 0, NULL, NULL,
               GmfIntVec, 5, &QadTab[1][0], &QadTab[ NmbQad ][0]);

   // Close the quad mesh
   GmfCloseMesh(InpMsh);


   /*-----------------------------------*/
   /* Create the triangluated mesh      */
   /*-----------------------------------*/

   for(i=1;i<=NmbQad;i++)
   {
      TriTab[i*2-1][0] = QadTab[i][0];
      TriTab[i*2-1][1] = QadTab[i][1];
      TriTab[i*2-1][2] = QadTab[i][2];
      TriTab[i*2-1][3] = QadTab[i][4];

      TriTab[i*2][0] = QadTab[i][0];
      TriTab[i*2][1] = QadTab[i][2];
      TriTab[i*2][2] = QadTab[i][3];
      TriTab[i*2][3] = QadTab[i][4];
   }


   /*-----------------------------------*/
   /* Write the triangle mesh           */
   /*-----------------------------------*/

   if(!(OutMsh = GmfOpenMesh("tri.meshb", GmfWrite, ver, dim)))
      return(1);

   // Write the vertices
   GmfSetKwd(OutMsh, GmfVertices, NmbVer);
   GmfSetBlock(OutMsh, GmfVertices, 1, NmbVer, 0, NULL, NULL,
               GmfFloat, &VerTab[1][0], &VerTab[ NmbVer ][0],
               GmfFloat, &VerTab[1][1], &VerTab[ NmbVer ][1],
               GmfFloat, &VerTab[1][2], &VerTab[ NmbVer ][2],
               GmfInt,   &RefTab[1],    &RefTab[ NmbVer ] );

   // Write the triangles
   GmfSetKwd(OutMsh, GmfTriangles, 2*NmbQad);
   GmfSetBlock(OutMsh, GmfTriangles, 1, 2*NmbQad, 0, NULL, NULL,
               GmfInt, &TriTab[1][0], &TriTab[ 2*NmbQad ][0],
               GmfInt, &TriTab[1][1], &TriTab[ 2*NmbQad ][1],
               GmfInt, &TriTab[1][2], &TriTab[ 2*NmbQad ][2],
               GmfInt, &TriTab[1][3], &TriTab[ 2*NmbQad ][3] );

   // Do not forget to close the mesh file
   GmfCloseMesh(OutMsh);
   printf("OutMsh : nmb triangles = %d\n", 2*NmbQad);

   free(QadTab);
   free(TriTab);
   free(RefTab);
   free(VerTab);

   return(0);
}